

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeep.h
# Opt level: O0

TreeEPSubTree * __thiscall
libDAI::TreeEP::TreeEPSubTree::operator=(TreeEPSubTree *this,TreeEPSubTree *x)

{
  TreeEPSubTree *in_RSI;
  TreeEPSubTree *in_RDI;
  vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *in_stack_00000088;
  vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_> *in_stack_00000090;
  
  if (in_RDI != in_RSI) {
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator=
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               in_stack_00000090,
               (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               in_stack_00000088);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator=
              ((vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               in_stack_00000090,
               (vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_> *)
               in_stack_00000088);
    std::vector<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>::operator=
              (in_stack_00000090,in_stack_00000088);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_00000090,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_00000088);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_00000090,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_00000088);
    in_RDI->_I = in_RSI->_I;
    VarSet::operator=((VarSet *)in_RSI,(VarSet *)in_RDI);
    VarSet::operator=((VarSet *)in_RSI,(VarSet *)in_RDI);
    in_RDI->_logZ = in_RSI->_logZ;
  }
  return in_RDI;
}

Assistant:

TreeEPSubTree & operator=( const TreeEPSubTree& x ) {
                        if( this != &x ) {
                            _Qa         = x._Qa;
                            _Qb         = x._Qb;
                            _RTree      = x._RTree;
                            _a          = x._a;
                            _b          = x._b;
                            _I          = x._I;
                            _ns         = x._ns;
                            _nsrem      = x._nsrem;
                            _logZ       = x._logZ;
                        }
                        return *this;
                    }